

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_plugin.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  AlphaNum *a;
  Arena *pAVar4;
  string_view src;
  string local_150;
  AlphaNum local_120;
  string local_f0;
  undefined1 local_d0 [72];
  CodeGeneratorRequest request;
  
  google::protobuf::compiler::CodeGeneratorRequest::CodeGeneratorRequest(&request);
  bVar1 = google::protobuf::MessageLite::ParseFromFileDescriptor((MessageLite *)&request,0);
  if (bVar1) {
    if (request.field_0._impl_.file_to_generate_.super_RepeatedPtrFieldBase.current_size_ != 0) {
      google::protobuf::compiler::CodeGeneratorResponse::CodeGeneratorResponse
                ((CodeGeneratorResponse *)local_d0);
      local_d0._56_8_ = 2;
      local_d0._64_8_ = 0x7fffffff000003e6;
      local_d0[0x10] = local_d0[0x10] | 0xe;
      pVVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                         ((RepeatedPtrFieldBase *)(local_d0 + 0x18));
      pVVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&request.field_0._impl_.file_to_generate_.super_RepeatedPtrFieldBase,0);
      local_150._M_string_length = (size_type)(pVVar3->_M_dataplus)._M_p;
      local_150._M_dataplus._M_p = (pointer)pVVar3->_M_string_length;
      local_120.piece_ = absl::lts_20250127::NullSafeStringView(".request");
      a = &local_120;
      absl::lts_20250127::StrCat_abi_cxx11_(&local_f0,(lts_20250127 *)&local_150,a,a);
      *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
      pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pVVar2->field_0)._impl_.name_,&local_f0,pAVar4);
      std::__cxx11::string::~string((string *)&local_f0);
      pVVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                         ((RepeatedPtrFieldBase *)(local_d0 + 0x18),0);
      google::protobuf::MessageLite::SerializeAsString_abi_cxx11_
                ((string *)&local_120,(MessageLite *)&request);
      src._M_str = (char *)a;
      src._M_len = local_120.piece_._M_len;
      absl::lts_20250127::Base64Escape_abi_cxx11_
                (&local_150,(lts_20250127 *)local_120.piece_._M_str,src);
      *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 4;
      pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pVVar2->field_0)._impl_.content_,&local_150,pAVar4);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_120);
      bVar1 = google::protobuf::MessageLite::SerializeToFileDescriptor((MessageLite *)local_d0,1);
      if (bVar1) {
        google::protobuf::compiler::CodeGeneratorResponse::~CodeGeneratorResponse
                  ((CodeGeneratorResponse *)local_d0);
        google::protobuf::compiler::CodeGeneratorRequest::~CodeGeneratorRequest(&request);
        return 0;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
                 ,0x2e,"response.SerializeToFileDescriptor(STDOUT_FILENO)");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_150);
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
               ,0x24,"!request.file_to_generate().empty()");
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
               ,0x23,"request.ParseFromFileDescriptor(STDIN_FILENO)");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_d0);
}

Assistant:

int main(int argc, char* argv[]) {

#ifdef _WIN32
  google::protobuf::io::win32::setmode(STDIN_FILENO, _O_BINARY);
  google::protobuf::io::win32::setmode(STDOUT_FILENO, _O_BINARY);
#endif

  CodeGeneratorRequest request;
  ABSL_CHECK(request.ParseFromFileDescriptor(STDIN_FILENO));
  ABSL_CHECK(!request.file_to_generate().empty());
  CodeGeneratorResponse response;
  response.set_supported_features(
      CodeGeneratorResponse::FEATURE_SUPPORTS_EDITIONS);
  response.set_minimum_edition(google::protobuf::Edition::EDITION_PROTO2);
  response.set_maximum_edition(google::protobuf::Edition::EDITION_MAX);
  response.add_file()->set_name(
      absl::StrCat(request.file_to_generate(0), ".request"));
  response.mutable_file(0)->set_content(
      absl::Base64Escape(request.SerializeAsString()));
  ABSL_CHECK(response.SerializeToFileDescriptor(STDOUT_FILENO));
  return 0;
}